

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::renderHintsChanged(QRasterPaintEngine *this)

{
  Int IVar1;
  QRasterPaintEngineState *pQVar2;
  QFlags<QPainter::RenderHint> *in_RDI;
  long in_FS_OFFSET;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  QRasterPaintEnginePrivate *d;
  bool was_cosmetic_brush;
  bool was_bilinear;
  bool was_aa;
  QRasterPaintEngineState *s;
  RenderHint in_stack_ffffffffffffffbc;
  undefined5 in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_14;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_10;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = state((QRasterPaintEngine *)0x562bfa);
  bVar3 = (*(ushort *)&pQVar2->field_12 >> 3 & 1) != 0;
  bVar4 = (*(ushort *)&pQVar2->field_12 >> 4 & 1) != 0;
  bVar5 = (*(ushort *)&pQVar2->field_12 >> 8 & 1) != 0;
  local_c.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  *(ushort *)&pQVar2->field_12 = *(ushort *)&pQVar2->field_12 & 0xfff7 | (ushort)(IVar1 != 0) << 3;
  local_10.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  *(ushort *)&pQVar2->field_12 = *(ushort *)&pQVar2->field_12 & 0xffef | (ushort)(IVar1 != 0) << 4;
  local_14.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  *(ushort *)&pQVar2->field_12 = *(ushort *)&pQVar2->field_12 & 0xfeff | (ushort)(IVar1 == 0) << 8;
  if ((ushort)(bVar3 & 1) != (*(ushort *)&pQVar2->field_12 >> 3 & 1)) {
    pQVar2->strokeFlags = pQVar2->strokeFlags | 0x200;
  }
  if (((ushort)(bVar4 & 1) != (*(ushort *)&pQVar2->field_12 >> 4 & 1)) ||
     ((ushort)(bVar5 & 1) != (*(ushort *)&pQVar2->field_12 >> 8 & 1))) {
    pQVar2->strokeFlags = pQVar2->strokeFlags | 1;
    pQVar2->fillFlags = pQVar2->fillFlags | 2;
  }
  d_func((QRasterPaintEngine *)0x562e13);
  QRasterPaintEnginePrivate::recalculateFastImages
            ((QRasterPaintEnginePrivate *)
             CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(bVar5,in_stack_ffffffffffffffd0))));
  if ((ushort)(bVar3 & 1) != (*(ushort *)&pQVar2->field_12 >> 3 & 1)) {
    QRasterPaintEnginePrivate::updateClipping
              ((QRasterPaintEnginePrivate *)
               CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(bVar5,in_stack_ffffffffffffffd0))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::renderHintsChanged()
{
    QRasterPaintEngineState *s = state();

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::renderHintsChanged()" << Qt::hex << s->renderHints;
#endif

    bool was_aa = s->flags.antialiased;
    bool was_bilinear = s->flags.bilinear;
    bool was_cosmetic_brush = s->flags.cosmetic_brush;

    s->flags.antialiased = bool(s->renderHints & QPainter::Antialiasing);
    s->flags.bilinear = bool(s->renderHints & QPainter::SmoothPixmapTransform);
    s->flags.cosmetic_brush = !bool(s->renderHints & QPainter::NonCosmeticBrushPatterns);

    if (was_aa != s->flags.antialiased)
        s->strokeFlags |= DirtyHints;

    if (was_bilinear != s->flags.bilinear || was_cosmetic_brush != s->flags.cosmetic_brush) {
        s->strokeFlags |= DirtyPen;
        s->fillFlags |= DirtyBrush;
    }

    Q_D(QRasterPaintEngine);
    d->recalculateFastImages();

    if (was_aa != s->flags.antialiased)
        d->updateClipping();
}